

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::read_symbol(tokenizer *this)

{
  initializer_list<char> __l;
  bool bVar1;
  mapped_type *pmVar2;
  _Self local_88;
  _Self local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  char *local_70;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60 [3];
  allocator_type local_44;
  char local_43 [11];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<char,_std::allocator<char>_> symbols;
  tokenizer *this_local;
  
  builtin_strncpy(local_43,"+-*/%<>=!&|",0xb);
  local_38 = local_43;
  local_30 = 0xb;
  symbols.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this;
  std::allocator<char>::allocator();
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_28,__l,&local_44);
  std::allocator<char>::~allocator(&local_44);
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  while (*this->line_char != '\0') {
    local_68._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_28);
    local_70 = (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)local_28);
    local_60[0] = std::
                  find<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                            (local_68,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       )local_70,this->line_char);
    local_78._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)local_28);
    bVar1 = __gnu_cxx::operator==<char_*,_std::vector<char,_std::allocator<char>_>_>
                      (local_60,&local_78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->current_word,*this->line_char);
    advance_to_next_character(this);
  }
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
       ::find(&this->symbol_to_type,&this->current_word);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
       ::end(&this->keyword_to_token_type);
  bVar1 = std::operator==(&local_80,&local_88);
  if (bVar1) {
    add_token_to_stream(this,invalid);
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
             ::operator[](&this->symbol_to_type,&this->current_word);
    add_token_to_stream(this,*pmVar2);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->current_word,"");
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_28)
  ;
  return;
}

Assistant:

void tokenizer::read_symbol() {
    vector<char> symbols = {'+', '-', '*', '/', '%', '<', '>', '=', '!', '&', '|'};

    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(find(symbols.begin(), symbols.end(), *line_char) != symbols.end()) {
            current_word += *line_char;
            this->advance_to_next_character();
        }
        else {
            break;
        }
    }

    if(symbol_to_type.find(current_word) == keyword_to_token_type.end()) {
        this->add_token_to_stream(Token_Type::invalid);
    }
    else {
        this->add_token_to_stream(symbol_to_type[current_word]);
    }

    //position_number += current_word.length();
    current_word = "";
}